

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d2tf.c
# Opt level: O0

void iauD2tf(int ndp,double days,char *sign,int *ihmsf)

{
  int *piVar1;
  undefined1 uVar2;
  int iVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined1 *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double af;
  double as;
  double am;
  double ah;
  double w;
  double a;
  double rh;
  double rm;
  double rs;
  int n;
  int nrs;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_48;
  int local_28;
  int local_24;
  
  piVar1 = (int *)CONCAT71(in_register_00000011,in_DL);
  uVar2 = 0x2d;
  if (0.0 <= in_XMM0_Qa) {
    uVar2 = 0x2b;
  }
  *in_RSI = uVar2;
  local_48 = ABS(in_XMM0_Qa) * 86400.0;
  if (in_EDI < 0) {
    local_24 = 1;
    for (local_28 = 1; local_28 == -in_EDI || SBORROW4(local_28,-in_EDI) != local_28 + in_EDI < 0;
        local_28 = local_28 + 1) {
      iVar3 = 10;
      if (local_28 == 2 || local_28 == 4) {
        iVar3 = 6;
      }
      local_24 = iVar3 * local_24;
    }
    local_48 = local_48 / (double)local_24;
    if (0.5 <= ABS(local_48)) {
      if (0.0 <= local_48) {
        local_90 = floor(local_48 + 0.5);
      }
      else {
        local_90 = ceil(local_48 - 0.5);
      }
      local_88 = local_90;
    }
    else {
      local_88 = 0.0;
    }
    local_48 = (double)local_24 * local_88;
  }
  local_24 = 1;
  for (local_28 = 1; local_28 <= in_EDI; local_28 = local_28 + 1) {
    local_24 = local_24 * 10;
  }
  dVar4 = (double)local_24;
  dVar5 = dVar4 * 60.0;
  if (0.5 <= ABS(dVar4 * local_48)) {
    if (0.0 <= dVar4 * local_48) {
      local_a0 = floor(dVar4 * local_48 + 0.5);
    }
    else {
      local_a0 = ceil(dVar4 * local_48 + -0.5);
    }
    local_98 = local_a0;
  }
  else {
    local_98 = 0.0;
  }
  dVar6 = local_98 / (dVar5 * 60.0);
  if (0.0 <= dVar6) {
    local_a8 = floor(dVar6);
  }
  else {
    local_a8 = ceil(dVar6);
  }
  local_98 = -local_a8 * dVar5 * 60.0 + local_98;
  dVar6 = local_98 / dVar5;
  if (0.0 <= dVar6) {
    local_b0 = floor(dVar6);
  }
  else {
    local_b0 = ceil(dVar6);
  }
  local_98 = -local_b0 * dVar5 + local_98;
  dVar5 = local_98 / dVar4;
  if (0.0 <= dVar5) {
    local_b8 = floor(dVar5);
  }
  else {
    local_b8 = ceil(dVar5);
  }
  *piVar1 = (int)local_a8;
  piVar1[1] = (int)local_b0;
  piVar1[2] = (int)local_b8;
  piVar1[3] = (int)(-local_b8 * dVar4 + local_98);
  return;
}

Assistant:

void iauD2tf(int ndp, double days, char *sign, int ihmsf[4])
/*
**  - - - - - - - -
**   i a u D 2 t f
**  - - - - - - - -
**
**  Decompose days to hours, minutes, seconds, fraction.
**
**  This function is part of the International Astronomical Union's
**  SOFA (Standards Of Fundamental Astronomy) software collection.
**
**  Status:  vector/matrix support function.
**
**  Given:
**     ndp     int     resolution (Note 1)
**     days    double  interval in days
**
**  Returned:
**     sign    char*   '+' or '-'
**     ihmsf   int[4]  hours, minutes, seconds, fraction
**
**  Notes:
**
**  1) The argument ndp is interpreted as follows:
**
**     ndp         resolution
**      :      ...0000 00 00
**     -7         1000 00 00
**     -6          100 00 00
**     -5           10 00 00
**     -4            1 00 00
**     -3            0 10 00
**     -2            0 01 00
**     -1            0 00 10
**      0            0 00 01
**      1            0 00 00.1
**      2            0 00 00.01
**      3            0 00 00.001
**      :            0 00 00.000...
**
**  2) The largest positive useful value for ndp is determined by the
**     size of days, the format of double on the target platform, and
**     the risk of overflowing ihmsf[3].  On a typical platform, for
**     days up to 1.0, the available floating-point precision might
**     correspond to ndp=12.  However, the practical limit is typically
**     ndp=9, set by the capacity of a 32-bit int, or ndp=4 if int is
**     only 16 bits.
**
**  3) The absolute value of days may exceed 1.0.  In cases where it
**     does not, it is up to the caller to test for and handle the
**     case where days is very nearly 1.0 and rounds up to 24 hours,
**     by testing for ihmsf[0]=24 and setting ihmsf[0-3] to zero.
**
**  This revision:  2021 May 11
**
**  SOFA release 2021-05-12
**
**  Copyright (C) 2021 IAU SOFA Board.  See notes at end.
*/
{
   int nrs, n;
   double rs, rm, rh, a, w, ah, am, as, af;


/* Handle sign. */
   *sign = (char) ( ( days >= 0.0 ) ? '+' : '-' );

/* Interval in seconds. */
   a = DAYSEC * fabs(days);

/* Pre-round if resolution coarser than 1s (then pretend ndp=1). */
   if (ndp < 0) {
      nrs = 1;
      for (n = 1; n <= -ndp; n++) {
          nrs *= (n == 2 || n == 4) ? 6 : 10;
      }
      rs = (double) nrs;
      w = a / rs;
      a = rs * dnint(w);
   }

/* Express the unit of each field in resolution units. */
   nrs = 1;
   for (n = 1; n <= ndp; n++) {
      nrs *= 10;
   }
   rs = (double) nrs;
   rm = rs * 60.0;
   rh = rm * 60.0;

/* Round the interval and express in resolution units. */
   a = dnint(rs * a);

/* Break into fields. */
   ah = a / rh;
   ah = dint(ah);
   a -= ah * rh;
   am = a / rm;
   am = dint(am);
   a -= am * rm;
   as = a / rs;
   as = dint(as);
   af = a - as * rs;

/* Return results. */
   ihmsf[0] = (int) ah;
   ihmsf[1] = (int) am;
   ihmsf[2] = (int) as;
   ihmsf[3] = (int) af;

/* Finished. */

/*----------------------------------------------------------------------
**
**  Copyright (C) 2021
**  Standards Of Fundamental Astronomy Board
**  of the International Astronomical Union.
**
**  =====================
**  SOFA Software License
**  =====================
**
**  NOTICE TO USER:
**
**  BY USING THIS SOFTWARE YOU ACCEPT THE FOLLOWING SIX TERMS AND
**  CONDITIONS WHICH APPLY TO ITS USE.
**
**  1. The Software is owned by the IAU SOFA Board ("SOFA").
**
**  2. Permission is granted to anyone to use the SOFA software for any
**     purpose, including commercial applications, free of charge and
**     without payment of royalties, subject to the conditions and
**     restrictions listed below.
**
**  3. You (the user) may copy and distribute SOFA source code to others,
**     and use and adapt its code and algorithms in your own software,
**     on a world-wide, royalty-free basis.  That portion of your
**     distribution that does not consist of intact and unchanged copies
**     of SOFA source code files is a "derived work" that must comply
**     with the following requirements:
**
**     a) Your work shall be marked or carry a statement that it
**        (i) uses routines and computations derived by you from
**        software provided by SOFA under license to you; and
**        (ii) does not itself constitute software provided by and/or
**        endorsed by SOFA.
**
**     b) The source code of your derived work must contain descriptions
**        of how the derived work is based upon, contains and/or differs
**        from the original SOFA software.
**
**     c) The names of all routines in your derived work shall not
**        include the prefix "iau" or "sofa" or trivial modifications
**        thereof such as changes of case.
**
**     d) The origin of the SOFA components of your derived work must
**        not be misrepresented;  you must not claim that you wrote the
**        original software, nor file a patent application for SOFA
**        software or algorithms embedded in the SOFA software.
**
**     e) These requirements must be reproduced intact in any source
**        distribution and shall apply to anyone to whom you have
**        granted a further right to modify the source code of your
**        derived work.
**
**     Note that, as originally distributed, the SOFA software is
**     intended to be a definitive implementation of the IAU standards,
**     and consequently third-party modifications are discouraged.  All
**     variations, no matter how minor, must be explicitly marked as
**     such, as explained above.
**
**  4. You shall not cause the SOFA software to be brought into
**     disrepute, either by misuse, or use for inappropriate tasks, or
**     by inappropriate modification.
**
**  5. The SOFA software is provided "as is" and SOFA makes no warranty
**     as to its use or performance.   SOFA does not and cannot warrant
**     the performance or results which the user may obtain by using the
**     SOFA software.  SOFA makes no warranties, express or implied, as
**     to non-infringement of third party rights, merchantability, or
**     fitness for any particular purpose.  In no event will SOFA be
**     liable to the user for any consequential, incidental, or special
**     damages, including any lost profits or lost savings, even if a
**     SOFA representative has been advised of such damages, or for any
**     claim by any third party.
**
**  6. The provision of any version of the SOFA software under the terms
**     and conditions specified herein does not imply that future
**     versions will also be made available under the same terms and
**     conditions.
*
**  In any published work or commercial product which uses the SOFA
**  software directly, acknowledgement (see www.iausofa.org) is
**  appreciated.
**
**  Correspondence concerning SOFA software should be addressed as
**  follows:
**
**      By email:  sofa@ukho.gov.uk
**      By post:   IAU SOFA Center
**                 HM Nautical Almanac Office
**                 UK Hydrographic Office
**                 Admiralty Way, Taunton
**                 Somerset, TA1 2DN
**                 United Kingdom
**
**--------------------------------------------------------------------*/
}